

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int pagerOpenWal(Pager *pPager)

{
  u8 uVar1;
  sqlite3_vfs *psVar2;
  char *pcVar3;
  i64 iVar4;
  sqlite3_file *psVar5;
  int iVar6;
  uint uVar7;
  Wal *pWal;
  u64 n;
  int flags;
  uint local_3c;
  sqlite3_file *local_38;
  
  if (pPager->exclusiveMode == '\0') {
    iVar6 = 0;
  }
  else {
    iVar6 = pagerExclusiveLock(pPager);
  }
  if (iVar6 == 0) {
    psVar2 = pPager->pVfs;
    local_38 = pPager->fd;
    pcVar3 = pPager->zWal;
    uVar1 = pPager->exclusiveMode;
    iVar4 = pPager->journalSizeLimit;
    pPager->pWal = (Wal *)0x0;
    n = (long)psVar2->szOsFile + 0x90;
    pWal = (Wal *)sqlite3Malloc(n);
    if (pWal == (Wal *)0x0) {
      iVar6 = 7;
    }
    else {
      memset(pWal,0,n);
      pWal->pVfs = psVar2;
      pWal->pWalFd = (sqlite3_file *)(pWal + 1);
      pWal->pDbFd = local_38;
      pWal->readLock = -1;
      pWal->mxWalSize = iVar4;
      pWal->zWalName = pcVar3;
      pWal->syncHeader = '\x01';
      pWal->padToSectorBoundary = '\x01';
      pWal->exclusiveMode = (uVar1 != '\0') * '\x02';
      local_3c = 0x80006;
      iVar6 = (*psVar2->xOpen)(psVar2,pcVar3,(sqlite3_file *)(pWal + 1),0x80006,(int *)&local_3c);
      if (iVar6 == 0) {
        if ((local_3c & 1) != 0) {
          pWal->readOnly = '\x01';
        }
        if (local_38->pMethods == (sqlite3_io_methods *)0x0) {
          uVar7 = 0;
        }
        else {
          uVar7 = (*local_38->pMethods->xDeviceCharacteristics)(local_38);
        }
        if ((uVar7 >> 10 & 1) != 0) {
          pWal->syncHeader = '\0';
        }
        if ((uVar7 >> 0xc & 1) != 0) {
          pWal->padToSectorBoundary = '\0';
        }
        pPager->pWal = pWal;
      }
      else {
        walIndexClose(pWal,0);
        psVar5 = pWal->pWalFd;
        if (psVar5->pMethods != (sqlite3_io_methods *)0x0) {
          (*psVar5->pMethods->xClose)(psVar5);
          psVar5->pMethods = (sqlite3_io_methods *)0x0;
        }
        sqlite3_free(pWal);
      }
    }
  }
  pagerFixMaplimit(pPager);
  return iVar6;
}

Assistant:

static int pagerOpenWal(Pager *pPager){
  int rc = SQLITE_OK;

  assert( pPager->pWal==0 && pPager->tempFile==0 );
  assert( pPager->eLock==SHARED_LOCK || pPager->eLock==EXCLUSIVE_LOCK );

  /* If the pager is already in exclusive-mode, the WAL module will use
  ** heap-memory for the wal-index instead of the VFS shared-memory
  ** implementation. Take the exclusive lock now, before opening the WAL
  ** file, to make sure this is safe.
  */
  if( pPager->exclusiveMode ){
    rc = pagerExclusiveLock(pPager);
  }

  /* Open the connection to the log file. If this operation fails,
  ** (e.g. due to malloc() failure), return an error code.
  */
  if( rc==SQLITE_OK ){
    rc = sqlite3WalOpen(pPager->pVfs,
        pPager->fd, pPager->zWal, pPager->exclusiveMode,
        pPager->journalSizeLimit, &pPager->pWal
    );
  }
  pagerFixMaplimit(pPager);

  return rc;
}